

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_lzma.c
# Opt level: O1

void test_write_filter_lzma(void)

{
  int iVar1;
  wchar_t wVar2;
  void *pvVar3;
  void *__s;
  archive *paVar4;
  char *pcVar5;
  ssize_t sVar6;
  int64_t iVar7;
  ulong uVar8;
  uint uVar9;
  archive_entry *ae;
  size_t used2;
  char path [16];
  size_t used1;
  archive_entry *local_68;
  void *local_60;
  void *local_58;
  size_t local_50;
  char local_48 [16];
  size_t local_38;
  
  pvVar3 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                   ,L'.',(uint)(pvVar3 != (void *)0x0),"NULL != (buff = (char *)malloc(buffsize))",
                   (void *)0x0);
  if (pvVar3 != (void *)0x0) {
    __s = malloc(10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                     ,L'3',(uint)(__s != (void *)0x0),"NULL != (data = (char *)malloc(datasize))",
                     (void *)0x0);
    if (__s != (void *)0x0) {
      memset(__s,0,10000);
      paVar4 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                       ,L'=',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_write_set_format_ustar(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                          ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                          paVar4);
      iVar1 = archive_write_add_filter_lzma(paVar4);
      if (iVar1 == -0x1e) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                       ,L'A');
        test_skipping("lzma writing not supported on this platform");
        wVar2 = L'B';
      }
      else {
        iVar1 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'H',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar1 = archive_filter_code(paVar4,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'I',5,"ARCHIVE_FILTER_LZMA",(long)iVar1,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar5 = archive_filter_name(paVar4,0);
        local_58 = __s;
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                   ,L'J',"lzma","\"lzma\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        local_60 = pvVar3;
        iVar1 = archive_write_open_memory(paVar4,pvVar3,2000000,&local_38);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'L',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
        iVar1 = archive_filter_code(paVar4,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'M',5,"ARCHIVE_FILTER_LZMA",(long)iVar1,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar5 = archive_filter_name(paVar4,0);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                   ,L'N',"lzma","\"lzma\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        local_68 = archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'O',(uint)(local_68 != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype(local_68,0x8000);
        archive_entry_set_size(local_68,10000);
        uVar8 = 0;
        do {
          sprintf(local_48,"file%03d",uVar8);
          archive_entry_copy_pathname(local_68,local_48);
          iVar1 = archive_write_header(paVar4,local_68);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4)
          ;
          sVar6 = archive_write_data(paVar4,local_58,10000);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                           ,L'W',(uint)(sVar6 == 10000),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
          uVar9 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar9;
        } while (uVar9 != 100);
        archive_entry_free(local_68);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'Z',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'[',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L']',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                            paVar4);
        iVar1 = archive_read_support_filter_lzma(paVar4);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'a');
          test_skipping(
                       "Can\'t verify lzma writing by reading back; lzma reading not fully supported on this platform"
                       );
        }
        else {
          iVar1 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                              paVar4);
          iVar1 = archive_read_open_memory(paVar4,local_60,local_38);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'g',0,"ARCHIVE_OK",(long)iVar1,
                              "archive_read_open_memory(a, buff, used1)",paVar4);
          uVar8 = 0;
          do {
            sprintf(local_48,"file%03d",uVar8);
            iVar1 = archive_read_next_header(paVar4,&local_68);
            wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                                        ,L'k',0,"ARCHIVE_OK",(long)iVar1,
                                        "archive_read_next_header(a, &ae)",(void *)0x0);
            if (wVar2 == L'\0') break;
            pcVar5 = archive_entry_pathname(local_68);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                       ,L'm',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
            iVar7 = archive_entry_size(local_68);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                                ,L'n',10000,"(int)datasize",iVar7,"archive_entry_size(ae)",
                                (void *)0x0);
            uVar9 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar9;
          } while (uVar9 != 100);
          iVar1 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
        }
        iVar1 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'x',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar1 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'{',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar1 = archive_write_add_filter_lzma(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_lzma(a)",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"nonexistent-option","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'~',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"nonexistent-option\", \"0\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","abc");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'\x80',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","99");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'\x82',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"99\")"
                            ,paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","9");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")"
                            ,paVar4);
        iVar1 = archive_write_open_memory(paVar4,local_60,2000000,&local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        pvVar3 = local_58;
        uVar8 = 0;
        do {
          sprintf(local_48,"file%03d",uVar8);
          local_68 = archive_entry_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                           ,L'\x88',(uint)(local_68 != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
          archive_entry_copy_pathname(local_68,local_48);
          archive_entry_set_size(local_68,10000);
          archive_entry_set_filetype(local_68,0x8000);
          iVar1 = archive_write_header(paVar4,local_68);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'\x8c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",
                              paVar4);
          sVar6 = archive_write_data(paVar4,pvVar3,10000);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                           ,L'\x8d',(uint)(sVar6 == 10000),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
          archive_entry_free(local_68);
          uVar9 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar9;
        } while (uVar9 != 100);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'\x90',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'\x91',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0)
        ;
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'\x94',(uint)(paVar4 != (archive *)0x0),
                         "(a = archive_read_new()) != NULL",(void *)0x0);
        iVar1 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)"
                            ,paVar4);
        iVar1 = archive_read_support_filter_lzma(paVar4);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'\x98');
          test_skipping("lzma reading not fully supported on this platform");
        }
        else {
          iVar1 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,
                              "archive_read_support_filter_all(a)",paVar4);
          iVar1 = archive_read_open_memory(paVar4,local_60,local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'\x9d',0,"ARCHIVE_OK",(long)iVar1,
                              "archive_read_open_memory(a, buff, used2)",paVar4);
          uVar8 = 0;
          do {
            sprintf(local_48,"file%03d",uVar8);
            failure("Trying to read %s",local_48);
            iVar1 = archive_read_next_header(paVar4,&local_68);
            wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                                        ,L'¢',0,"ARCHIVE_OK",(long)iVar1,
                                        "archive_read_next_header(a, &ae)",paVar4);
            if (wVar2 == L'\0') break;
            pcVar5 = archive_entry_pathname(local_68);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                       ,L'¤',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
            ;
            iVar7 = archive_entry_size(local_68);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                                ,L'¥',10000,"(int)datasize",iVar7,"archive_entry_size(ae)",
                                (void *)0x0);
            uVar9 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar9;
          } while (uVar9 != 100);
          iVar1 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'§',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
        }
        pvVar3 = local_60;
        iVar1 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'©',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'®',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar1 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'±',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar1 = archive_write_add_filter_lzma(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'²',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_lzma(a)",
                            paVar4);
        iVar1 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'´',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"0\")"
                            ,paVar4);
        iVar1 = archive_write_open_memory(paVar4,pvVar3,2000000,&local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'µ',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        pvVar3 = local_58;
        uVar8 = 0;
        do {
          sprintf(local_48,"file%03d",uVar8);
          local_68 = archive_entry_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                           ,L'¸',(uint)(local_68 != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
          archive_entry_copy_pathname(local_68,local_48);
          archive_entry_set_size(local_68,10000);
          archive_entry_set_filetype(local_68,0x8000);
          iVar1 = archive_write_header(paVar4,local_68);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'¼',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar4
                             );
          failure("Writing file %s",local_48);
          sVar6 = archive_write_data(paVar4,pvVar3,10000);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'¿',10000,"datasize",sVar6,
                              "(size_t)archive_write_data(a, data, datasize)",paVar4);
          archive_entry_free(local_68);
          uVar9 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar9;
        } while (uVar9 != 100);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'Â',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'Ã',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'Ï',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'Ð',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                            paVar4);
        iVar1 = archive_read_support_filter_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'Ñ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                            paVar4);
        iVar1 = archive_read_support_filter_lzma(paVar4);
        if (iVar1 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'Ô');
          test_skipping("lzma reading not fully supported on this platform");
        }
        else {
          iVar1 = archive_read_open_memory(paVar4,local_60,local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'×',0,"ARCHIVE_OK",(long)iVar1,
                              "archive_read_open_memory(a, buff, used2)",paVar4);
          uVar8 = 0;
          do {
            sprintf(local_48,"file%03d",uVar8);
            iVar1 = archive_read_next_header(paVar4,&local_68);
            wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                                        ,L'Û',0,"ARCHIVE_OK",(long)iVar1,
                                        "archive_read_next_header(a, &ae)",(void *)0x0);
            if (wVar2 == L'\0') break;
            pcVar5 = archive_entry_pathname(local_68);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                       ,L'Ý',local_48,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
            ;
            iVar7 = archive_entry_size(local_68);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                                ,L'Þ',10000,"(int)datasize",iVar7,"archive_entry_size(ae)",
                                (void *)0x0);
            uVar9 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar9;
          } while (uVar9 != 100);
          iVar1 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                              ,L'à',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
        }
        iVar1 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'â',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'è',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_add_filter_lzma(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'é',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_lzma(a)",
                            paVar4);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'ê',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'ì',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_add_filter_lzma(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'í',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_lzma(a)",
                            paVar4);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'î',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'ï',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'ñ',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'ò',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar1 = archive_write_add_filter_lzma(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'ó',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_lzma(a)",
                            paVar4);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'ô',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        iVar1 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'õ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                         ,L'÷',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar1 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'ø',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar1 = archive_write_add_filter_lzma(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'ù',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_lzma(a)",
                            paVar4);
        __s = local_60;
        iVar1 = archive_write_open_memory(paVar4,local_60,2000000,&local_50);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'ú',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        iVar1 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                            ,L'û',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
        wVar2 = L'ü';
        pvVar3 = local_58;
      }
      iVar1 = archive_write_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_lzma.c"
                          ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(pvVar3);
      pvVar3 = __s;
    }
    free(pvVar3);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_lzma)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2;
	int i, r;

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_lzma(a);
	if (r == ARCHIVE_FATAL) {
		skipping("lzma writing not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_LZMA, archive_filter_code(a, 0));
	assertEqualString("lzma", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assertEqualInt(ARCHIVE_FILTER_LZMA, archive_filter_code(a, 0));
	assertEqualString("lzma", archive_filter_name(a, 0));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lzma(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify lzma writing by reading back;"
		    " lzma reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "99"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));


	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_lzma(a);
	if (r == ARCHIVE_WARN) {
		skipping("lzma reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			failure("Trying to read %s", path);
			if (!assertEqualIntA(a, ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat again, with much lower compression.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "0"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		failure("Writing file %s", path);
		assertEqualIntA(a, datasize,
		    (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* It would be nice to assert that compression-level=0 produced
	 * consistently larger/smaller results than the default compression,
	 * but the results here vary a lot depending on the version of liblzma
	 * being used. */
	/* 
	failure("Compression-level=0 wrote %d bytes; default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 > used1);
	*/

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_lzma(a);
	if (r == ARCHIVE_WARN) {
		skipping("lzma reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			sprintf(path, "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_lzma(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}